

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O1

RealType __thiscall OpenMD::Snapshot::getExcludedPotential(Snapshot *this)

{
  int i;
  long lVar1;
  double dVar2;
  
  if (this->hasExcludedPotential == false) {
    (this->frameData).excludedPotential = 0.0;
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar2 = dVar2 + (this->frameData).excludedPotentials.data_[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 7);
    (this->frameData).excludedPotential = dVar2;
    this->hasExcludedPotential = true;
    this->hasPotentialEnergy = false;
    this->hasTotalEnergy = false;
  }
  return (this->frameData).excludedPotential;
}

Assistant:

RealType Snapshot::getExcludedPotential() {
    if (!hasExcludedPotential) {
      frameData.excludedPotential = 0.0;
      for (int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        frameData.excludedPotential += frameData.excludedPotentials[i];
      }
      hasExcludedPotential = true;
      hasPotentialEnergy   = false;
      hasTotalEnergy       = false;
    }
    return frameData.excludedPotential;
  }